

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O0

input_options * parse_source(vw *all,options_i *options)

{
  bool bVar1;
  byte bVar2;
  options_boost_po *this;
  option_group_definition *key;
  undefined8 uVar3;
  ostream *this_00;
  long *in_RDX;
  long in_RSI;
  input_options *in_RDI;
  stringstream __msg;
  string data;
  options_boost_po *boost_options;
  options_i *options_ptr;
  option_group_definition input_options;
  input_options *parsed_options;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffe2e8;
  undefined6 in_stack_ffffffffffffe2f0;
  undefined1 in_stack_ffffffffffffe2f6;
  byte in_stack_ffffffffffffe2f7;
  string *in_stack_ffffffffffffe2f8;
  string *in_stack_ffffffffffffe300;
  allocator *paVar4;
  undefined6 in_stack_ffffffffffffe308;
  undefined1 in_stack_ffffffffffffe30e;
  undefined1 in_stack_ffffffffffffe30f;
  parser *in_stack_ffffffffffffe310;
  int iVar6;
  long *plVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe318;
  undefined7 in_stack_ffffffffffffe320;
  undefined1 in_stack_ffffffffffffe327;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffe338;
  option_group_definition *in_stack_ffffffffffffe340;
  byte local_1cb2;
  byte local_1c7a;
  byte local_1c4a;
  long local_1c38;
  string *token;
  allocator local_1a21;
  string local_1a20 [37];
  byte local_19fb;
  byte local_19fa;
  allocator local_19f9;
  string local_19f8 [39];
  undefined1 local_19d1;
  stringstream local_19b0 [16];
  ostream local_19a0;
  byte local_1823;
  byte local_1822;
  allocator local_1821;
  string local_1820 [37];
  byte local_17fb;
  byte local_17fa;
  allocator local_17f9;
  string local_17f8 [39];
  allocator local_17d1;
  string local_17d0 [32];
  string local_17b0 [37];
  byte local_178b;
  byte local_178a;
  allocator local_1789;
  string local_1788 [37];
  byte local_1763;
  byte local_1762;
  allocator local_1761;
  string local_1760 [39];
  allocator local_1739;
  string local_1738 [32];
  string local_1718 [32];
  long local_16f8;
  long *local_16f0;
  allocator local_16e1;
  string local_16e0 [39];
  allocator local_16b9;
  string local_16b8 [359];
  allocator local_1551;
  string local_1550 [39];
  allocator local_1529;
  string local_1528 [359];
  allocator local_13c1;
  string local_13c0 [39];
  allocator local_1399;
  string local_1398 [39];
  allocator local_1371;
  string local_1370 [359];
  allocator local_1209;
  string local_1208 [39];
  undefined1 local_11e1 [360];
  allocator local_1079;
  string local_1078 [39];
  allocator local_1051;
  string local_1050 [359];
  allocator local_ee9;
  string local_ee8 [39];
  allocator local_ec1;
  string local_ec0 [359];
  allocator local_d59;
  string local_d58 [39];
  allocator local_d31;
  string local_d30 [39];
  allocator local_d09;
  string local_d08 [359];
  allocator local_ba1;
  string local_ba0 [39];
  allocator local_b79;
  string local_b78 [359];
  allocator local_a11;
  string local_a10 [39];
  allocator local_9e9;
  string local_9e8 [359];
  allocator local_881;
  string local_880 [39];
  allocator local_859;
  string local_858 [359];
  allocator local_6f1;
  string local_6f0 [39];
  allocator local_6c9;
  string local_6c8 [359];
  allocator local_561;
  string local_560 [39];
  allocator local_539;
  string local_538 [359];
  allocator local_3d1;
  string local_3d0 [39];
  allocator local_3a9;
  string local_3a8 [359];
  allocator local_241;
  string local_240 [39];
  allocator local_219;
  string local_218 [39];
  allocator local_1f1;
  string local_1f0 [375];
  allocator local_79;
  string local_78 [32];
  undefined1 local_58 [63];
  byte local_19;
  long *local_18;
  long local_10;
  
  local_19 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  ::input_options::input_options
            ((input_options *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"Input options",&local_79);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)),
             (string *)in_stack_ffffffffffffe2e8);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,"data",&local_1f1);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffe2f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_218,"d",&local_219);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  short_name((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT17(in_stack_ffffffffffffe2f7,
                         CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)),
             (string *)in_stack_ffffffffffffe2e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_240,"Example set",&local_241);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)CONCAT17(in_stack_ffffffffffffe2f7,
                   CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)),
       (string *)in_stack_ffffffffffffe2e8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT17(in_stack_ffffffffffffe2f7,
                           CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)),
               in_stack_ffffffffffffe2e8);
  VW::config::option_group_definition::add<std::__cxx11::string>
            (in_stack_ffffffffffffe340,in_stack_ffffffffffffe338);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3a8,"daemon",&local_3a9);
  VW::config::make_option<bool>
            (in_stack_ffffffffffffe2f8,
             (bool *)CONCAT17(in_stack_ffffffffffffe2f7,
                              CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d0,"persistent daemon mode on port 26542",&local_3d1);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)),
             (string *)in_stack_ffffffffffffe2e8);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)),
             (typed_option<bool> *)in_stack_ffffffffffffe2e8);
  VW::config::option_group_definition::add<bool>
            (in_stack_ffffffffffffe340,(typed_option<bool> *)in_stack_ffffffffffffe338);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_538,"foreground",&local_539);
  VW::config::make_option<bool>
            (in_stack_ffffffffffffe2f8,
             (bool *)CONCAT17(in_stack_ffffffffffffe2f7,
                              CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_560,"in persistent daemon mode, do not run in the background",&local_561);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)),
             (string *)in_stack_ffffffffffffe2e8);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)),
             (typed_option<bool> *)in_stack_ffffffffffffe2e8);
  VW::config::option_group_definition::add<bool>
            (in_stack_ffffffffffffe340,(typed_option<bool> *)in_stack_ffffffffffffe338);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6c8,"port",&local_6c9);
  VW::config::make_option<unsigned_long>
            (in_stack_ffffffffffffe2f8,
             (unsigned_long *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6f0,"port to listen on; use 0 to pick unused port",&local_6f1);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)),
             (string *)in_stack_ffffffffffffe2e8);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)),
             (typed_option<unsigned_long> *)in_stack_ffffffffffffe2e8);
  VW::config::option_group_definition::add<unsigned_long>
            (in_stack_ffffffffffffe340,(typed_option<unsigned_long> *)in_stack_ffffffffffffe338);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_858,"num_children",&local_859);
  VW::config::make_option<unsigned_long>
            (in_stack_ffffffffffffe2f8,
             (unsigned_long *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_880,"number of children for persistent daemon mode",&local_881)
  ;
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)),
             (string *)in_stack_ffffffffffffe2e8);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)),
             (typed_option<unsigned_long> *)in_stack_ffffffffffffe2e8);
  VW::config::option_group_definition::add<unsigned_long>
            (in_stack_ffffffffffffe340,(typed_option<unsigned_long> *)in_stack_ffffffffffffe338);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9e8,"pid_file",&local_9e9);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffe2f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a10,"Write pid file in persistent daemon mode",&local_a11);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)CONCAT17(in_stack_ffffffffffffe2f7,
                   CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)),
       (string *)in_stack_ffffffffffffe2e8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT17(in_stack_ffffffffffffe2f7,
                           CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)),
               in_stack_ffffffffffffe2e8);
  VW::config::option_group_definition::add<std::__cxx11::string>
            (in_stack_ffffffffffffe340,in_stack_ffffffffffffe338);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b78,"port_file",&local_b79);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffe2f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ba0,"Write port used in persistent daemon mode",&local_ba1);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)CONCAT17(in_stack_ffffffffffffe2f7,
                   CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)),
       (string *)in_stack_ffffffffffffe2e8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT17(in_stack_ffffffffffffe2f7,
                           CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)),
               in_stack_ffffffffffffe2e8);
  VW::config::option_group_definition::add<std::__cxx11::string>
            (in_stack_ffffffffffffe340,in_stack_ffffffffffffe338);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d08,"cache",&local_d09);
  VW::config::make_option<bool>
            (in_stack_ffffffffffffe2f8,
             (bool *)CONCAT17(in_stack_ffffffffffffe2f7,
                              CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d30,"c",&local_d31);
  VW::config::typed_option<bool>::short_name
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)),
             (string *)in_stack_ffffffffffffe2e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d58,"Use a cache.  The default is <data>.cache",&local_d59);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)),
             (string *)in_stack_ffffffffffffe2e8);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)),
             (typed_option<bool> *)in_stack_ffffffffffffe2e8);
  VW::config::option_group_definition::add<bool>
            (in_stack_ffffffffffffe340,(typed_option<bool> *)in_stack_ffffffffffffe338);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ec0,"cache_file",&local_ec1);
  VW::config::make_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_ffffffffffffe2f8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT17(in_stack_ffffffffffffe2f7,
                         CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ee8,"The location(s) of cache_file.",&local_ee9);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::help((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)CONCAT17(in_stack_ffffffffffffe2f7,
                     CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)),
         (string *)in_stack_ffffffffffffe2e8);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)CONCAT17(in_stack_ffffffffffffe2f7,
                             CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)),
                 (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffe2e8);
  VW::config::option_group_definition::
  add<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_ffffffffffffe340,
             (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_ffffffffffffe338);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1050,"json",&local_1051);
  VW::config::make_option<bool>
            (in_stack_ffffffffffffe2f8,
             (bool *)CONCAT17(in_stack_ffffffffffffe2f7,
                              CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1078,"Enable JSON parsing.",&local_1079);
  this = (options_boost_po *)
         VW::config::typed_option<bool>::help
                   ((typed_option<bool> *)
                    CONCAT17(in_stack_ffffffffffffe2f7,
                             CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)),
                    (string *)in_stack_ffffffffffffe2e8);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)),
             (typed_option<bool> *)in_stack_ffffffffffffe2e8);
  key = VW::config::option_group_definition::add<bool>
                  (in_stack_ffffffffffffe340,(typed_option<bool> *)in_stack_ffffffffffffe338);
  token = (string *)local_11e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_11e1 + 1),"dsjson",(allocator *)token);
  VW::config::make_option<bool>
            (in_stack_ffffffffffffe2f8,
             (bool *)CONCAT17(in_stack_ffffffffffffe2f7,
                              CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)));
  paVar4 = &local_1209;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1208,"Enable Decision Service JSON parsing.",paVar4);
  iVar6 = (int)((ulong)paVar4 >> 0x20);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)),
             (string *)in_stack_ffffffffffffe2e8);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)),
             (typed_option<bool> *)in_stack_ffffffffffffe2e8);
  VW::config::option_group_definition::add<bool>
            (in_stack_ffffffffffffe340,(typed_option<bool> *)in_stack_ffffffffffffe338);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1370,"kill_cache",&local_1371);
  VW::config::make_option<bool>
            (in_stack_ffffffffffffe2f8,
             (bool *)CONCAT17(in_stack_ffffffffffffe2f7,
                              CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1398,"k",&local_1399);
  VW::config::typed_option<bool>::short_name
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)),
             (string *)in_stack_ffffffffffffe2e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_13c0,"do not reuse existing cache: create a new one always",&local_13c1);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)),
             (string *)in_stack_ffffffffffffe2e8);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)),
             (typed_option<bool> *)in_stack_ffffffffffffe2e8);
  VW::config::option_group_definition::add<bool>
            (in_stack_ffffffffffffe340,(typed_option<bool> *)in_stack_ffffffffffffe338);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1528,"compressed",&local_1529);
  VW::config::make_option<bool>
            (in_stack_ffffffffffffe2f8,
             (bool *)CONCAT17(in_stack_ffffffffffffe2f7,
                              CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1550,
             "use gzip format whenever possible. If a cache file is being created, this option creates a compressed cache file. A mixture of raw-text & compressed inputs are supported with autodetection."
             ,&local_1551);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)),
             (string *)in_stack_ffffffffffffe2e8);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)),
             (typed_option<bool> *)in_stack_ffffffffffffe2e8);
  VW::config::option_group_definition::add<bool>
            (in_stack_ffffffffffffe340,(typed_option<bool> *)in_stack_ffffffffffffe338);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_16b8,"no_stdin",&local_16b9);
  VW::config::make_option<bool>
            (in_stack_ffffffffffffe2f8,
             (bool *)CONCAT17(in_stack_ffffffffffffe2f7,
                              CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_16e0,"do not default to reading from stdin",&local_16e1);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)),
             (string *)in_stack_ffffffffffffe2e8);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)),
             (typed_option<bool> *)in_stack_ffffffffffffe2e8);
  VW::config::option_group_definition::add<bool>
            (in_stack_ffffffffffffe340,(typed_option<bool> *)in_stack_ffffffffffffe338);
  VW::config::typed_option<bool>::~typed_option
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)));
  std::__cxx11::string::~string(local_16e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_16e1);
  VW::config::typed_option<bool>::~typed_option
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)));
  std::__cxx11::string::~string(local_16b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_16b9);
  VW::config::typed_option<bool>::~typed_option
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)));
  std::__cxx11::string::~string(local_1550);
  std::allocator<char>::~allocator((allocator<char> *)&local_1551);
  VW::config::typed_option<bool>::~typed_option
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)));
  std::__cxx11::string::~string(local_1528);
  std::allocator<char>::~allocator((allocator<char> *)&local_1529);
  VW::config::typed_option<bool>::~typed_option
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)));
  std::__cxx11::string::~string(local_13c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_13c1);
  std::__cxx11::string::~string(local_1398);
  std::allocator<char>::~allocator((allocator<char> *)&local_1399);
  VW::config::typed_option<bool>::~typed_option
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)));
  std::__cxx11::string::~string(local_1370);
  std::allocator<char>::~allocator((allocator<char> *)&local_1371);
  VW::config::typed_option<bool>::~typed_option
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)));
  std::__cxx11::string::~string(local_1208);
  std::allocator<char>::~allocator((allocator<char> *)&local_1209);
  VW::config::typed_option<bool>::~typed_option
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)));
  std::__cxx11::string::~string((string *)(local_11e1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_11e1);
  VW::config::typed_option<bool>::~typed_option
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)));
  std::__cxx11::string::~string(local_1078);
  std::allocator<char>::~allocator((allocator<char> *)&local_1079);
  VW::config::typed_option<bool>::~typed_option
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)));
  std::__cxx11::string::~string(local_1050);
  std::allocator<char>::~allocator((allocator<char> *)&local_1051);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)CONCAT17(in_stack_ffffffffffffe2f7,
                              CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)));
  std::__cxx11::string::~string(local_ee8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ee9);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)CONCAT17(in_stack_ffffffffffffe2f7,
                              CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)));
  std::__cxx11::string::~string(local_ec0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ec1);
  VW::config::typed_option<bool>::~typed_option
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)));
  std::__cxx11::string::~string(local_d58);
  std::allocator<char>::~allocator((allocator<char> *)&local_d59);
  std::__cxx11::string::~string(local_d30);
  std::allocator<char>::~allocator((allocator<char> *)&local_d31);
  VW::config::typed_option<bool>::~typed_option
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)));
  std::__cxx11::string::~string(local_d08);
  std::allocator<char>::~allocator((allocator<char> *)&local_d09);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)CONCAT17(in_stack_ffffffffffffe2f7,
                            CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)));
  std::__cxx11::string::~string(local_ba0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ba1);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)CONCAT17(in_stack_ffffffffffffe2f7,
                            CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)));
  std::__cxx11::string::~string(local_b78);
  std::allocator<char>::~allocator((allocator<char> *)&local_b79);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)CONCAT17(in_stack_ffffffffffffe2f7,
                            CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)));
  std::__cxx11::string::~string(local_a10);
  std::allocator<char>::~allocator((allocator<char> *)&local_a11);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)CONCAT17(in_stack_ffffffffffffe2f7,
                            CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)));
  std::__cxx11::string::~string(local_9e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9e9);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)));
  std::__cxx11::string::~string(local_880);
  std::allocator<char>::~allocator((allocator<char> *)&local_881);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)));
  std::__cxx11::string::~string(local_858);
  std::allocator<char>::~allocator((allocator<char> *)&local_859);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)));
  std::__cxx11::string::~string(local_6f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6f1);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)));
  std::__cxx11::string::~string(local_6c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6c9);
  VW::config::typed_option<bool>::~typed_option
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)));
  std::__cxx11::string::~string(local_560);
  std::allocator<char>::~allocator((allocator<char> *)&local_561);
  VW::config::typed_option<bool>::~typed_option
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)));
  std::__cxx11::string::~string(local_538);
  std::allocator<char>::~allocator((allocator<char> *)&local_539);
  VW::config::typed_option<bool>::~typed_option
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)));
  std::__cxx11::string::~string(local_3d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
  VW::config::typed_option<bool>::~typed_option
            ((typed_option<bool> *)
             CONCAT17(in_stack_ffffffffffffe2f7,
                      CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)));
  std::__cxx11::string::~string(local_3a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)CONCAT17(in_stack_ffffffffffffe2f7,
                            CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)));
  std::__cxx11::string::~string(local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)CONCAT17(in_stack_ffffffffffffe2f7,
                            CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)));
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  (**(code **)*local_18)(local_18,local_58);
  local_16f0 = local_18;
  if (local_18 == (long *)0x0) {
    local_1c38 = 0;
  }
  else {
    local_1c38 = __dynamic_cast(local_18,&VW::config::options_i::typeinfo,
                                &VW::config::options_boost_po::typeinfo,0);
  }
  local_16f8 = local_1c38;
  if (local_1c38 != 0) {
    std::__cxx11::string::string(local_1718);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1738,"data",&local_1739);
    bVar1 = VW::config::options_boost_po::try_get_positional_option_token
                      (this,&key->m_name,token,iVar6);
    std::__cxx11::string::~string(local_1738);
    std::allocator<char>::~allocator((allocator<char> *)&local_1739);
    if ((bVar1) &&
       (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_ffffffffffffe2f7,
                                          CONCAT16(in_stack_ffffffffffffe2f6,
                                                   in_stack_ffffffffffffe2f0)),
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffffe2e8), bVar1)) {
      std::__cxx11::string::operator=((string *)(local_10 + 0x60),local_1718);
    }
    std::__cxx11::string::~string(local_1718);
  }
  plVar5 = local_18;
  local_1762 = 0;
  local_1763 = 0;
  local_178a = 0;
  local_178b = 0;
  local_1c4a = 1;
  if ((in_RDI->daemon & 1U) == 0) {
    std::allocator<char>::allocator();
    local_1762 = 1;
    std::__cxx11::string::string(local_1760,"pid_file",&local_1761);
    local_1763 = 1;
    bVar2 = (**(code **)(*plVar5 + 8))(plVar5,local_1760);
    plVar5 = local_18;
    local_1c4a = 1;
    if ((bVar2 & 1) == 0) {
      std::allocator<char>::allocator();
      local_178a = 1;
      std::__cxx11::string::string(local_1788,"port",&local_1789);
      local_178b = 1;
      bVar2 = (**(code **)(*plVar5 + 8))(plVar5,local_1788);
      local_1c7a = 0;
      if ((bVar2 & 1) != 0) {
        local_1c7a = *(byte *)(local_10 + 0x343b) ^ 0xff;
      }
      local_1c4a = local_1c7a;
    }
  }
  if ((local_178b & 1) != 0) {
    std::__cxx11::string::~string(local_1788);
  }
  if ((local_178a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1789);
  }
  if ((local_1763 & 1) != 0) {
    std::__cxx11::string::~string(local_1760);
  }
  if ((local_1762 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1761);
  }
  if ((local_1c4a & 1) != 0) {
    *(undefined1 *)(local_10 + 0x80) = 1;
    *(undefined8 *)(local_10 + 0x348) = 100000;
  }
  if ((in_RDI->cache & 1U) != 0) {
    std::operator+(in_stack_ffffffffffffe318,(char *)in_stack_ffffffffffffe310);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT17(in_stack_ffffffffffffe2f7,
                            CONCAT16(in_stack_ffffffffffffe2f6,in_stack_ffffffffffffe2f0)),
                (value_type *)in_stack_ffffffffffffe2e8);
    std::__cxx11::string::~string(local_17b0);
  }
  if ((in_RDI->compressed & 1U) != 0) {
    set_compressed(in_stack_ffffffffffffe310);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_17d0,".gz",&local_17d1);
  bVar1 = ends_with((string *)
                    CONCAT17(in_stack_ffffffffffffe30f,
                             CONCAT16(in_stack_ffffffffffffe30e,in_stack_ffffffffffffe308)),
                    in_stack_ffffffffffffe300);
  std::__cxx11::string::~string(local_17d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_17d1);
  if (bVar1) {
    set_compressed(in_stack_ffffffffffffe310);
  }
  plVar5 = local_18;
  iVar6 = (int)((ulong)in_stack_ffffffffffffe310 >> 0x20);
  local_17fa = 0;
  local_17fb = 0;
  local_1822 = 0;
  local_1823 = 0;
  if ((in_RDI->cache & 1U) == 0) {
    std::allocator<char>::allocator();
    local_17fa = 1;
    std::__cxx11::string::string(local_17f8,"cache_file",&local_17f9);
    local_17fb = 1;
    bVar2 = (**(code **)(*plVar5 + 8))(plVar5,local_17f8);
    local_1cb2 = 0;
    if ((bVar2 & 1) == 0) goto LAB_001346b9;
  }
  paVar4 = &local_1821;
  plVar5 = local_18;
  std::allocator<char>::allocator();
  local_1822 = 1;
  std::__cxx11::string::string(local_1820,"invert_hash",paVar4);
  local_1823 = 1;
  local_1cb2 = (**(code **)(*plVar5 + 8))(plVar5,local_1820);
LAB_001346b9:
  if ((local_1823 & 1) != 0) {
    std::__cxx11::string::~string(local_1820);
  }
  if ((local_1822 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1821);
  }
  if ((local_17fb & 1) != 0) {
    std::__cxx11::string::~string(local_17f8);
  }
  if ((local_17fa & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_17f9);
  }
  if ((local_1cb2 & 1) == 0) {
    local_19fa = 0;
    local_19fb = 0;
    bVar1 = false;
    bVar2 = 0;
    if ((*(byte *)(local_10 + 0x3457) & 1) == 0) {
      paVar4 = &local_19f9;
      plVar5 = local_18;
      std::allocator<char>::allocator();
      local_19fa = 1;
      std::__cxx11::string::string(local_19f8,"output_feature_regularizer_binary",paVar4);
      local_19fb = 1;
      bVar2 = (**(code **)(*plVar5 + 8))(plVar5,local_19f8);
      bVar1 = (bVar2 & 1) == 0;
      bVar2 = 1;
      if (bVar1) {
        paVar4 = &local_1a21;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1a20,"output_feature_regularizer_text",paVar4);
        in_stack_ffffffffffffe2f7 = (**(code **)(*local_18 + 8))(local_18,local_1a20);
        bVar2 = in_stack_ffffffffffffe2f7;
      }
    }
    if (bVar1) {
      std::__cxx11::string::~string(local_1a20);
      std::allocator<char>::~allocator((allocator<char> *)&local_1a21);
    }
    if ((local_19fb & 1) != 0) {
      std::__cxx11::string::~string(local_19f8);
    }
    if ((local_19fa & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_19f9);
    }
    if ((bVar2 & 1) != 0) {
      *(undefined1 *)(local_10 + 0x3457) = 1;
      this_00 = std::operator<<((ostream *)(local_10 + 0xe0),
                                "Making holdout_set_off=true since output regularizer specified");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
    local_19 = 1;
    VW::config::option_group_definition::~option_group_definition
              ((option_group_definition *)
               CONCAT17(in_stack_ffffffffffffe2f7,CONCAT16(bVar2,in_stack_ffffffffffffe2f0)));
    if ((local_19 & 1) == 0) {
      ::input_options::~input_options
                ((input_options *)
                 CONCAT17(in_stack_ffffffffffffe2f7,CONCAT16(bVar2,in_stack_ffffffffffffe2f0)));
    }
    return in_RDI;
  }
  std::__cxx11::stringstream::stringstream(local_19b0);
  std::operator<<(&local_19a0,
                  "invert_hash is incompatible with a cache file.  Use it in single pass mode only."
                 );
  local_19d1 = 1;
  uVar3 = __cxa_allocate_exception(0x38);
  std::__cxx11::stringstream::str();
  VW::vw_exception::vw_exception
            ((vw_exception *)CONCAT17(in_stack_ffffffffffffe327,in_stack_ffffffffffffe320),
             (char *)in_stack_ffffffffffffe318,iVar6,
             (string *)
             CONCAT17(in_stack_ffffffffffffe30f,
                      CONCAT16(in_stack_ffffffffffffe30e,in_stack_ffffffffffffe308)));
  local_19d1 = 0;
  __cxa_throw(uVar3,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

input_options parse_source(vw& all, options_i& options)
{
  input_options parsed_options;

  option_group_definition input_options("Input options");
  input_options.add(make_option("data", all.data_filename).short_name("d").help("Example set"))
      .add(make_option("daemon", parsed_options.daemon).help("persistent daemon mode on port 26542"))
      .add(make_option("foreground", parsed_options.foreground)
               .help("in persistent daemon mode, do not run in the background"))
      .add(make_option("port", parsed_options.port).help("port to listen on; use 0 to pick unused port"))
      .add(make_option("num_children", all.num_children).help("number of children for persistent daemon mode"))
      .add(make_option("pid_file", parsed_options.pid_file).help("Write pid file in persistent daemon mode"))
      .add(make_option("port_file", parsed_options.port_file).help("Write port used in persistent daemon mode"))
      .add(make_option("cache", parsed_options.cache).short_name("c").help("Use a cache.  The default is <data>.cache"))
      .add(make_option("cache_file", parsed_options.cache_files).help("The location(s) of cache_file."))
      .add(make_option("json", parsed_options.json).help("Enable JSON parsing."))
      .add(make_option("dsjson", parsed_options.dsjson).help("Enable Decision Service JSON parsing."))
      .add(make_option("kill_cache", parsed_options.kill_cache)
               .short_name("k")
               .help("do not reuse existing cache: create a new one always"))
      .add(
          make_option("compressed", parsed_options.compressed)
              .help(
                  "use gzip format whenever possible. If a cache file is being created, this option creates a "
                  "compressed cache file. A mixture of raw-text & compressed inputs are supported with autodetection."))
      .add(make_option("no_stdin", all.stdin_off).help("do not default to reading from stdin"));

  options.add_and_parse(input_options);

  // If the option provider is program_options try and retrieve data as a positional parameter.
  options_i* options_ptr = &options;
  auto boost_options = dynamic_cast<options_boost_po*>(options_ptr);
  if (boost_options)
  {
    std::string data;
    if (boost_options->try_get_positional_option_token("data", data, -1))
    {
      if (all.data_filename != data)
      {
        all.data_filename = data;
      }
    }
  }

  if (parsed_options.daemon || options.was_supplied("pid_file") || (options.was_supplied("port") && !all.active))
  {
    all.daemon = true;
    // allow each child to process up to 1e5 connections
    all.numpasses = (size_t)1e5;
  }

  // Add an implicit cache file based on the data filename.
  if (parsed_options.cache)
  {
    parsed_options.cache_files.push_back(all.data_filename + ".cache");
  }

  if (parsed_options.compressed)
    set_compressed(all.p);

  if (ends_with(all.data_filename, ".gz"))
    set_compressed(all.p);

  if ((parsed_options.cache || options.was_supplied("cache_file")) && options.was_supplied("invert_hash"))
    THROW("invert_hash is incompatible with a cache file.  Use it in single pass mode only.");

  if (!all.holdout_set_off &&
      (options.was_supplied("output_feature_regularizer_binary") ||
          options.was_supplied("output_feature_regularizer_text")))
  {
    all.holdout_set_off = true;
    all.trace_message << "Making holdout_set_off=true since output regularizer specified" << endl;
  }

  return parsed_options;
}